

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O0

_Bool square_allowsfeel(chunk *c,loc_conflict grid)

{
  _Bool _Var1;
  undefined1 local_19;
  chunk *c_local;
  loc_conflict grid_local;
  
  _Var1 = square_ispassable(c,grid);
  local_19 = 0;
  if (_Var1) {
    _Var1 = square_isdamaging(c,grid);
    local_19 = 0;
    if (!_Var1) {
      _Var1 = square_isfall(c,grid);
      local_19 = _Var1 ^ 0xff;
    }
  }
  return (_Bool)(local_19 & 1);
}

Assistant:

bool square_allowsfeel(struct chunk *c, struct loc grid) {
	return square_ispassable(c, grid) && !square_isdamaging(c, grid) &&
		!square_isfall(c, grid);
}